

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O3

void __thiscall
TPZMatRed<double,_TPZFMatrix<double>_>::F1Red
          (TPZMatRed<double,_TPZFMatrix<double>_> *this,TPZFMatrix<double> *F1Red)

{
  TPZFMatrix<double> *x;
  TPZMatrixSolver<double> *pTVar1;
  
  if (this->fDim0 != 0) {
    x = &this->fF0;
    (*(F1Red->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (F1Red,(this->fK11).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
               (this->fF0).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol);
    if (this->fF0IsComputed == false) {
      DecomposeK00(this);
      pTVar1 = ((this->fSolver).fRef)->fPointer;
      (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(pTVar1,x,x,0);
      this->fF0IsComputed = true;
    }
    TPZFMatrix<double>::MultAdd(&this->fK10,x,&this->fF1,F1Red,-1.0,1.0,0);
    return;
  }
  TPZFMatrix<double>::operator=(F1Red,&this->fF1);
  return;
}

Assistant:

void TPZMatRed<TVar, TSideMatrix>::F1Red(TPZFMatrix<TVar> &F1Red)
{
	if (!fDim0)
    {
        F1Red = fF1;
        return;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "fF0 input " << std::endl;
        fF0.Print("fF0",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    F1Red.Resize(fK11.Rows(),fF0.Cols());
    if (!fF0IsComputed)
    {
        DecomposeK00();
        fSolver->Solve(fF0,fF0);
        fF0IsComputed = true;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "After computing F0Invert" << std::endl;
        fF0.Print("F0Invert",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Input fF1" << std::endl;
        fF1.Print("fF1",sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	//make [F1]=[F1]-[K10][F0Invert]
	fK10.MultAdd((fF0),fF1,(F1Red),-1,1);
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        F1Red.Print("F1 Reduced", sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	return;
}